

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O1

int funchook_install(funchook_t *funchook,int flags)

{
  undefined4 *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  funchook_entry_t *pfVar5;
  ulong uVar6;
  funchook_page_t *page;
  mem_state_t local_40;
  
  funchook_log(funchook,"Enter funchook_install(%p, 0x%x)\n",funchook);
  uVar4 = 2;
  if (funchook->installed == 0) {
    page = (funchook_page_t *)&funchook->page_list;
    do {
      page = page->next;
      if (page == (funchook_page_t *)0x0) {
        funchook->installed = 1;
        uVar4 = 0;
        break;
      }
      uVar3 = funchook_page_protect(funchook,page);
      if (uVar3 == 0) {
        if (page->used == 0) {
          bVar2 = true;
        }
        else {
          pfVar5 = page->entries;
          uVar6 = 0;
          do {
            uVar3 = funchook_unprotect_begin(funchook,&local_40,pfVar5->target_func,5);
            if (uVar3 == 0) {
              puVar1 = (undefined4 *)pfVar5->target_func;
              *(uint8_t *)(puVar1 + 1) = pfVar5->new_code[4];
              *puVar1 = *(undefined4 *)pfVar5->new_code;
              uVar3 = funchook_unprotect_end(funchook,&local_40);
              if (uVar3 != 0) goto LAB_001016fc;
              bVar2 = true;
            }
            else {
LAB_001016fc:
              uVar4 = uVar3;
              bVar2 = false;
            }
            if (!bVar2) break;
            uVar6 = uVar6 + 1;
            pfVar5 = pfVar5 + 1;
          } while (uVar6 < page->used);
        }
      }
      else {
        bVar2 = false;
        uVar4 = uVar3;
      }
    } while (bVar2);
  }
  funchook_log_end(funchook,"Leave funchook_install() => %d\n",(ulong)uVar4);
  return uVar4;
}

Assistant:

int funchook_install(funchook_t *funchook, int flags)
{
    int rv;

    funchook_log(funchook, "Enter funchook_install(%p, 0x%x)\n", funchook, flags);
    rv = funchook_install_internal(funchook, flags);
    funchook_log_end(funchook, "Leave funchook_install() => %d\n", rv);
    return rv;
}